

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.h
# Opt level: O2

uint llvm::ComputeEditDistance<char>
               (ArrayRef<char> FromArray,ArrayRef<char> ToArray,bool AllowReplacements,
               uint MaxEditDistance)

{
  char cVar1;
  uint uVar2;
  uint i;
  uint uVar3;
  uint uVar4;
  pointer __p;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  size_type x;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> Allocated;
  ArrayRef<char> ToArray_local;
  ArrayRef<char> FromArray_local;
  uint SmallBuffer [64];
  
  uVar7 = ToArray.Length;
  ToArray_local.Data = ToArray.Data;
  uVar9 = FromArray.Length;
  FromArray_local.Data = FromArray.Data;
  Allocated._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>)0x0;
  uVar6 = uVar7 + 1;
  ToArray_local.Length = uVar7;
  FromArray_local.Length = uVar9;
  if (uVar6 < 0x41) {
    __p = SmallBuffer;
  }
  else {
    __p = (pointer)operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4);
    std::__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>::reset
              ((__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)&Allocated,__p
              );
  }
  for (uVar3 = 1; uVar3 <= uVar7; uVar3 = uVar3 + 1) {
    __p[uVar3] = uVar3;
  }
  uVar3 = MaxEditDistance + 1;
  uVar6 = 1;
  do {
    if (uVar9 < uVar6) {
      uVar3 = __p[uVar7];
      break;
    }
    *__p = (uint)uVar6;
    uVar14 = 0;
    uVar10 = uVar6 & 0xffffffff;
    uVar13 = uVar6 - 1 & 0xffffffff;
    lVar8 = 1;
    while( true ) {
      if (uVar7 == uVar14) break;
      uVar2 = __p[uVar14 + 1];
      pcVar5 = ArrayRef<char>::operator[](&FromArray_local,uVar6 - 1);
      cVar1 = *pcVar5;
      pcVar5 = ArrayRef<char>::operator[](&ToArray_local,lVar8 - 1);
      if (AllowReplacements) {
        uVar11 = (uint)uVar13 + (uint)(cVar1 != *pcVar5);
        uVar4 = __p[uVar14];
        if (__p[uVar14 + 1] < __p[uVar14]) {
          uVar4 = __p[uVar14 + 1];
        }
        uVar12 = uVar4 + 1;
        if (uVar11 <= uVar4 + 1) {
          uVar12 = uVar11;
        }
      }
      else {
        uVar12 = (uint)uVar13;
        if (cVar1 != *pcVar5) {
          uVar12 = __p[uVar14];
          if (__p[uVar14 + 1] < __p[uVar14]) {
            uVar12 = __p[uVar14 + 1];
          }
          uVar12 = uVar12 + 1;
        }
      }
      if (uVar12 < (uint)uVar10) {
        uVar10 = (ulong)uVar12;
      }
      __p[uVar14 + 1] = uVar12;
      lVar8 = lVar8 + 1;
      uVar14 = uVar14 + 1;
      uVar13 = (ulong)uVar2;
    }
    uVar6 = uVar6 + 1;
  } while ((MaxEditDistance == 0) || ((uint)uVar10 <= MaxEditDistance));
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr(&Allocated);
  return uVar3;
}

Assistant:

unsigned ComputeEditDistance(ArrayRef<T> FromArray, ArrayRef<T> ToArray,
                             bool AllowReplacements = true,
                             unsigned MaxEditDistance = 0) {
  // The algorithm implemented below is the "classic"
  // dynamic-programming algorithm for computing the Levenshtein
  // distance, which is described here:
  //
  //   http://en.wikipedia.org/wiki/Levenshtein_distance
  //
  // Although the algorithm is typically described using an m x n
  // array, only one row plus one element are used at a time, so this
  // implementation just keeps one vector for the row.  To update one entry,
  // only the entries to the left, top, and top-left are needed.  The left
  // entry is in Row[x-1], the top entry is what's in Row[x] from the last
  // iteration, and the top-left entry is stored in Previous.
  typename ArrayRef<T>::size_type m = FromArray.size();
  typename ArrayRef<T>::size_type n = ToArray.size();

  const unsigned SmallBufferSize = 64;
  unsigned SmallBuffer[SmallBufferSize];
  std::unique_ptr<unsigned[]> Allocated;
  unsigned *Row = SmallBuffer;
  if (n + 1 > SmallBufferSize) {
    Row = new unsigned[n + 1];
    Allocated.reset(Row);
  }

  for (unsigned i = 1; i <= n; ++i)
    Row[i] = i;

  for (typename ArrayRef<T>::size_type y = 1; y <= m; ++y) {
    Row[0] = y;
    unsigned BestThisRow = Row[0];

    unsigned Previous = y - 1;
    for (typename ArrayRef<T>::size_type x = 1; x <= n; ++x) {
      int OldRow = Row[x];
      if (AllowReplacements) {
        Row[x] = std::min(
            Previous + (FromArray[y-1] == ToArray[x-1] ? 0u : 1u),
            std::min(Row[x-1], Row[x])+1);
      }
      else {
        if (FromArray[y-1] == ToArray[x-1]) Row[x] = Previous;
        else Row[x] = std::min(Row[x-1], Row[x]) + 1;
      }
      Previous = OldRow;
      BestThisRow = std::min(BestThisRow, Row[x]);
    }

    if (MaxEditDistance && BestThisRow > MaxEditDistance)
      return MaxEditDistance + 1;
  }

  unsigned Result = Row[n];
  return Result;
}